

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_DCtx_loadDictionary_advanced
                 (ZSTD_DCtx *dctx,void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
                 ZSTD_dictContentType_e dictContentType)

{
  ZSTD_DDict *pZVar1;
  ZSTD_dictContentType_e dictContentType_local;
  ZSTD_dictLoadMethod_e dictLoadMethod_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_DCtx *dctx_local;
  
  if (dctx->streamStage == zdss_init) {
    ZSTD_clearDict(dctx);
    if ((dict != (void *)0x0) && (7 < dictSize)) {
      pZVar1 = ZSTD_createDDict_advanced
                         (dict,dictSize,dictLoadMethod,dictContentType,dctx->customMem);
      dctx->ddictLocal = pZVar1;
      if (dctx->ddictLocal == (ZSTD_DDict *)0x0) {
        return 0xffffffffffffffc0;
      }
      dctx->ddict = dctx->ddictLocal;
      dctx->dictUses = ZSTD_use_indefinitely;
    }
    dctx_local = (ZSTD_DCtx *)0x0;
  }
  else {
    dctx_local = (ZSTD_DCtx *)0xffffffffffffffc4;
  }
  return (size_t)dctx_local;
}

Assistant:

size_t ZSTD_DCtx_loadDictionary_advanced(ZSTD_DCtx* dctx,
                                   const void* dict, size_t dictSize,
                                         ZSTD_dictLoadMethod_e dictLoadMethod,
                                         ZSTD_dictContentType_e dictContentType)
{
    RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong);
    ZSTD_clearDict(dctx);
    if (dict && dictSize >= 8) {
        dctx->ddictLocal = ZSTD_createDDict_advanced(dict, dictSize, dictLoadMethod, dictContentType, dctx->customMem);
        RETURN_ERROR_IF(dctx->ddictLocal == NULL, memory_allocation);
        dctx->ddict = dctx->ddictLocal;
        dctx->dictUses = ZSTD_use_indefinitely;
    }
    return 0;
}